

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3CreateIndex(Parse *pParse,Token *pName1,Token *pName2,SrcList *pTblName,ExprList *pList,
                       int onError,Token *pStart,Expr *pPIWhere,int sortOrder,int ifNotExist,
                       u8 idxType)

{
  u8 *puVar1;
  short sVar2;
  ushort uVar3;
  ushort uVar4;
  sqlite3 *db;
  Schema *pSVar5;
  Column *pCVar6;
  i16 *piVar7;
  i16 *piVar8;
  u8 uVar9;
  int iVar10;
  uint iDb;
  Table *pTVar11;
  Db *pDVar12;
  char *zName;
  Table *pTVar13;
  Expr *pEVar14;
  ExprList *pEVar15;
  size_t sVar16;
  Index *pIVar17;
  Expr *pEVar18;
  CollSeq *pCVar19;
  ulong uVar20;
  void *pvVar21;
  Index *pIVar22;
  Vdbe *p;
  Index *pIVar23;
  u16 uVar24;
  uint uVar25;
  Schema **ppSVar26;
  long lVar27;
  ExprList_item *pEVar28;
  Op *pOVar29;
  ulong uVar30;
  Bitmask BVar31;
  char *pcVar32;
  Token *pName_00;
  char *pcVar33;
  uchar uVar34;
  short *psVar35;
  uchar uVar36;
  ulong uVar37;
  ulong uVar38;
  long lVar39;
  ExprList_item *pEVar40;
  int local_e8;
  uint local_d0;
  char *local_c8;
  char *zExtra;
  long local_90;
  long local_88;
  Token *pName;
  char *local_78;
  Token prevCol;
  DbFixer sFix;
  
  db = pParse->db;
  pName = (Token *)0x0;
  zExtra = (char *)0x0;
  zName = (char *)0x0;
  if (db->mallocFailed != '\0') goto LAB_0015c15d;
  if ((pParse->nErr < 1) &&
     (((idxType == '\x02' || (pParse->eParseMode != '\x01')) &&
      (iVar10 = sqlite3ReadSchema(pParse), iVar10 == 0)))) {
    if (pTblName != (SrcList *)0x0) {
      iDb = sqlite3TwoPartName(pParse,pName1,pName2,&pName);
      if (-1 < (int)iDb) {
        if ((((db->init).busy == '\0') &&
            (pTVar11 = sqlite3SrcListLookup(pParse,pTblName),
            pTVar11 != (Table *)0x0 && pName2->n == 0)) && (pTVar11->pSchema == db->aDb[1].pSchema))
        {
          iDb = 1;
        }
        pName_00 = pName;
        pDVar12 = pParse->db->aDb;
        sFix.zDb = pDVar12[iDb].zDbSName;
        sFix.pSchema = pDVar12[iDb].pSchema;
        sFix.zType = "index";
        sFix.pName = pName;
        sFix.bVarOnly = (int)(iDb == 1);
        sFix.pParse = pParse;
        sqlite3FixSrcList(&sFix,pTblName);
        pTVar11 = sqlite3LocateTableItem(pParse,0,pTblName->a);
        zName = (char *)0x0;
        if (pTVar11 != (Table *)0x0) {
          if ((iDb != 1) || (db->aDb[1].pSchema == pTVar11->pSchema)) {
            if ((pTVar11->tabFlags & 0x20) != 0) {
              for (pIVar23 = pTVar11->pIndex; pIVar23 != (Index *)0x0; pIVar23 = pIVar23->pNext) {
                if ((*(ushort *)&pIVar23->field_0x63 & 3) == 2) goto LAB_0015c364;
              }
              goto LAB_0015c361;
            }
            pIVar23 = (Index *)0x0;
            goto LAB_0015c364;
          }
          zName = pTVar11->zName;
          pcVar32 = "cannot create a TEMP index on non-TEMP table \"%s\"";
          pcVar33 = (char *)0x0;
          goto LAB_0015c3e8;
        }
        goto LAB_0015c15d;
      }
      goto LAB_0015c15a;
    }
    pTVar11 = pParse->pNewTable;
    if (pTVar11 == (Table *)0x0) goto LAB_0015c15a;
    if (pTVar11->pSchema == (Schema *)0x0) {
      iDb = 0xfff0bdc0;
      pName_00 = (Token *)0x0;
    }
    else {
      iDb = 0xffffffff;
      pName_00 = (Token *)0x0;
      ppSVar26 = &db->aDb->pSchema;
      do {
        iDb = iDb + 1;
        pSVar5 = *ppSVar26;
        ppSVar26 = ppSVar26 + 4;
      } while (pSVar5 != pTVar11->pSchema);
    }
LAB_0015c361:
    pIVar23 = (Index *)0x0;
LAB_0015c364:
    lVar39 = (long)(int)iDb * 0x20;
    pDVar12 = db->aDb + (int)iDb;
    zName = pTVar11->zName;
    if (zName != (char *)0x0) {
      lVar27 = 0;
      do {
        if ((ulong)(byte)zName[lVar27] == 0) {
          uVar34 = ""[(byte)"sqlite_"[lVar27]];
          uVar36 = '\0';
LAB_0015c3c4:
          if (uVar36 != uVar34) goto LAB_0015c3f4;
          break;
        }
        uVar36 = ""[(byte)zName[lVar27]];
        uVar34 = ""[(byte)"sqlite_"[lVar27]];
        if (uVar36 != uVar34) goto LAB_0015c3c4;
        lVar27 = lVar27 + 1;
      } while (lVar27 != 7);
      if ((pTblName != (SrcList *)0x0) && ((db->init).busy == '\0')) {
        pcVar32 = "table %s may not be indexed";
        pcVar33 = (char *)0x0;
        goto LAB_0015c3e8;
      }
    }
LAB_0015c3f4:
    if (pTVar11->pSelect == (Select *)0x0) {
      if (pTVar11->nModuleArg != 0) {
        pcVar33 = "virtual tables may not be indexed";
        goto LAB_0015c411;
      }
      local_88 = lVar39;
      if (pName_00 != (Token *)0x0) {
        zName = sqlite3NameFromToken(db,pName_00);
        if (zName != (char *)0x0) {
          iVar10 = sqlite3CheckObjectName(pParse,zName);
          if (iVar10 == 0) {
            if (1 < pParse->eParseMode) goto LAB_0015c544;
            pcVar33 = zName;
            if (((db->init).busy == '\0') &&
               (pTVar13 = sqlite3FindTable(db,zName,(char *)0x0), pTVar13 != (Table *)0x0)) {
              pcVar32 = "there is already a table named %s";
            }
            else {
              pIVar17 = sqlite3FindIndex(db,zName,pDVar12->zDbSName);
              if (pIVar17 == (Index *)0x0) goto LAB_0015c4c5;
              if (ifNotExist != 0) {
                sqlite3CodeVerifySchema(pParse,iDb);
                goto LAB_0015c15d;
              }
              pcVar32 = "index %s already exists";
            }
LAB_0015c3e8:
            sqlite3ErrorMsg(pParse,pcVar32,zName);
            zName = pcVar33;
          }
          goto LAB_0015c15d;
        }
        goto LAB_0015c15a;
      }
      for (pIVar17 = pTVar11->pIndex; pIVar17 != (Index *)0x0; pIVar17 = pIVar17->pNext) {
      }
      zName = sqlite3MPrintf(db,"sqlite_autoindex_%s_%d");
      if (zName == (char *)0x0) goto LAB_0015c15a;
      if (pParse->eParseMode == '\0') {
LAB_0015c4ce:
        pcVar33 = pDVar12->zDbSName;
        pcVar32 = "sqlite_master";
        if (iDb == 1) {
          pcVar32 = "sqlite_temp_master";
        }
        iVar10 = sqlite3AuthCheck(pParse,0x12,pcVar32,(char *)0x0,pcVar33);
        if ((iVar10 != 0) ||
           (iVar10 = sqlite3AuthCheck(pParse,(uint)(iDb == 1) * 2 + 1,zName,pTVar11->zName,pcVar33),
           iVar10 != 0)) goto LAB_0015c15d;
      }
      else {
        zName[7] = zName[7] + '\x01';
LAB_0015c4c5:
        if (pParse->eParseMode < 2) goto LAB_0015c4ce;
      }
LAB_0015c544:
      if (pList == (ExprList *)0x0) {
        pCVar6 = pTVar11->aCol;
        sVar2 = pTVar11->nCol;
        puVar1 = &pCVar6[(long)sVar2 + -1].colFlags;
        *puVar1 = *puVar1 | 8;
        prevCol.z = pCVar6[(long)sVar2 + -1].zName;
        if (prevCol.z == (char *)0x0) {
          prevCol.n = 0;
        }
        else {
          sVar16 = strlen(prevCol.z);
          prevCol.n = (uint)sVar16 & 0x3fffffff;
        }
        pEVar14 = sqlite3ExprAlloc(db,0x3b,&prevCol,0);
        pEVar15 = sqlite3ExprListAppend((Parse *)pParse->db,(ExprList *)0x0,pEVar14);
        if (pEVar15 != (ExprList *)0x0) {
          if (-1 < sortOrder) {
            pEVar15->a[(long)pEVar15->nExpr + -1].sortOrder = (u8)sortOrder;
          }
          goto LAB_0015c66c;
        }
        pList = (ExprList *)0x0;
      }
      else {
        if (pParse->db->aLimit[2] < pList->nExpr) {
          sqlite3ErrorMsg(pParse,"too many columns in %s","index");
        }
        pEVar15 = pList;
        if (pParse->nErr == 0) {
LAB_0015c66c:
          iVar10 = pEVar15->nExpr;
          lVar39 = (long)iVar10;
          uVar24 = 1;
          local_e8 = 1;
          if (0 < lVar39) {
            lVar27 = 0;
            local_e8 = 0;
            local_90 = lVar39;
            do {
              pcVar33 = *(char **)((long)&pEVar15->a[0].pExpr + lVar27);
              if (*pcVar33 == 'j') {
                pcVar33 = *(char **)(pcVar33 + 8);
                if (pcVar33 == (char *)0x0) {
                  iVar10 = 1;
                }
                else {
                  sVar16 = strlen(pcVar33);
                  iVar10 = ((uint)sVar16 & 0x3fffffff) + 1;
                }
                local_e8 = local_e8 + iVar10;
              }
              lVar27 = lVar27 + 0x20;
            } while (lVar39 << 5 != lVar27);
            local_e8 = local_e8 + 1;
            iVar10 = (int)local_90;
          }
          sVar16 = strlen(zName);
          uVar25 = (uint)sVar16 & 0x3fffffff;
          if (pIVar23 != (Index *)0x0) {
            uVar24 = pIVar23->nKeyCol;
          }
          pIVar17 = sqlite3AllocateIndexObject(db,(short)iVar10 + uVar24,local_e8 + uVar25,&zExtra);
          pcVar33 = zExtra;
          pList = pEVar15;
          if (db->mallocFailed == '\0') {
            pIVar17->zName = zExtra;
            local_c8 = zExtra + (ulong)uVar25 + 1;
            zExtra = local_c8;
            memcpy(pcVar33,zName,(ulong)uVar25 + 1);
            pIVar17->pTable = pTVar11;
            pIVar17->onError = (u8)onError;
            *(ushort *)&pIVar17->field_0x63 =
                 (ushort)(idxType & 3) + (ushort)(onError != 0) * 8 |
                 *(ushort *)&pIVar17->field_0x63 & 0xfff4;
            pIVar17->pSchema = *(Schema **)((long)&db->aDb->pSchema + local_88);
            pIVar17->nKeyCol = (u16)pEVar15->nExpr;
            if (pPIWhere != (Expr *)0x0) {
              sqlite3ResolveSelfReference(pParse,pTVar11,2,pPIWhere,(ExprList *)0x0);
              pIVar17->pPartIdxWhere = pPIWhere;
            }
            local_90 = CONCAT71(local_90._1_7_,pDVar12->pSchema->file_format);
            if (1 < pParse->eParseMode) {
              pIVar17->aColExpr = pEVar15;
              pList = (ExprList *)0x0;
            }
            if (pIVar17->nKeyCol == 0) {
              uVar37 = 0;
            }
            else {
              pEVar40 = pEVar15->a;
              pPIWhere = (Expr *)0x0;
              uVar37 = 0;
              do {
                pEVar14 = pEVar40->pExpr;
                pEVar18 = pEVar14;
                if ((pEVar14->op == 'n') ||
                   ((pEVar14->op == 'j' && (pEVar18 = pEVar14->pLeft, pEVar18->op == 'n')))) {
                  pEVar18->op = ';';
                }
                sqlite3ResolveSelfReference(pParse,pTVar11,0x20,pEVar14,(ExprList *)0x0);
                if (pParse->nErr != 0) goto LAB_0015ce1d;
                pEVar18 = pEVar40->pExpr;
                uVar25 = pEVar18->flags;
                pEVar14 = pEVar18;
                while ((uVar25 >> 0xc & 1) != 0) {
                  if ((uVar25 >> 0x12 & 1) == 0) {
                    pEVar28 = (ExprList_item *)&pEVar14->pLeft;
                  }
                  else {
                    pEVar28 = ((pEVar14->x).pList)->a;
                  }
                  pEVar14 = pEVar28->pExpr;
                  uVar25 = pEVar14->flags;
                }
                pcVar33 = local_c8;
                if (pEVar14->op == 0xa2) {
                  uVar25 = (uint)pEVar14->iColumn;
                  if (pEVar14->iColumn < 0) {
                    uVar25 = (uint)pTVar11->iPKey;
                  }
                  else if (pTVar11->aCol[uVar25].notNull == '\0') {
                    pIVar17->field_0x63 = pIVar17->field_0x63 & 0xf7;
                    pEVar18 = pEVar40->pExpr;
                  }
                  pIVar17->aiColumn[uVar37] = (i16)uVar25;
                  if (pEVar18->op == 'j') {
LAB_0015c92a:
                    local_78 = (pEVar18->u).zToken;
                    if (local_78 == (char *)0x0) {
                      sVar16 = 1;
                    }
                    else {
                      sVar16 = strlen(local_78);
                      sVar16 = (ulong)((uint)sVar16 & 0x3fffffff) + 1;
                    }
                    memcpy(local_c8,local_78,sVar16);
                    zExtra = local_c8 + sVar16;
                    pcVar33 = zExtra;
                  }
                  else if ((int)uVar25 < 0) {
                    local_c8 = (char *)0x0;
                  }
                  else {
                    local_c8 = pTVar11->aCol[uVar25].zColl;
                  }
                }
                else {
                  if (pTVar11 == pParse->pNewTable) {
                    sqlite3ErrorMsg(pParse,
                                    "expressions prohibited in PRIMARY KEY and UNIQUE constraints");
                    goto LAB_0015d0e8;
                  }
                  if (pIVar17->aColExpr == (ExprList *)0x0) {
                    pIVar17->aColExpr = pList;
                    pList = (ExprList *)0x0;
                  }
                  pIVar17->aiColumn[uVar37] = -2;
                  pIVar17->field_0x63 = pIVar17->field_0x63 & 0xf7;
                  pEVar18 = pEVar40->pExpr;
                  if (pEVar18->op == 'j') goto LAB_0015c92a;
                  local_c8 = (char *)0x0;
                }
                if (local_c8 == (char *)0x0) {
                  local_c8 = "BINARY";
                }
                if (((db->init).busy == '\0') &&
                   (pCVar19 = sqlite3LocateCollSeq(pParse,local_c8), pCVar19 == (CollSeq *)0x0))
                goto LAB_0015ce21;
                uVar9 = '\0';
                pIVar17->azColl[uVar37] = local_c8;
                if (3 < (byte)local_90) {
                  uVar9 = (u8)*(undefined4 *)&pEVar40->sortOrder;
                }
                pIVar17->aSortOrder[uVar37] = uVar9;
                uVar37 = uVar37 + 1;
                pEVar40 = pEVar40 + 1;
                local_c8 = pcVar33;
              } while (uVar37 < pIVar17->nKeyCol);
            }
            if (pIVar23 == (Index *)0x0) {
              pIVar17->aiColumn[uVar37 & 0xffffffff] = -1;
              pIVar17->azColl[uVar37 & 0xffffffff] = "BINARY";
            }
            else {
              uVar24 = pIVar23->nKeyCol;
              if (uVar24 != 0) {
                uVar20 = 0;
                do {
                  uVar25 = (uint)pIVar17->nKeyCol;
                  psVar35 = pIVar17->aiColumn;
                  do {
                    if ((int)uVar25 < 1) {
                      iVar10 = (int)uVar37;
                      pIVar17->aiColumn[iVar10] = pIVar23->aiColumn[uVar20];
                      pIVar17->azColl[iVar10] = pIVar23->azColl[uVar20];
                      pIVar17->aSortOrder[iVar10] = pIVar23->aSortOrder[uVar20];
                      uVar37 = (ulong)(iVar10 + 1);
                      uVar24 = pIVar23->nKeyCol;
                      goto LAB_0015cada;
                    }
                    uVar25 = uVar25 - 1;
                    sVar2 = *psVar35;
                    psVar35 = psVar35 + 1;
                  } while (sVar2 != pIVar23->aiColumn[uVar20]);
                  pIVar17->nColumn = pIVar17->nColumn - 1;
LAB_0015cada:
                  uVar20 = uVar20 + 1;
                } while (uVar20 < uVar24);
              }
            }
            sqlite3DefaultRowEst(pIVar17);
            if (pParse->pNewTable == (Table *)0x0) {
              estimateIndexWidth(pIVar17);
            }
            uVar3 = pIVar17->nColumn;
            uVar37 = (ulong)uVar3;
            if (uVar37 == 0) {
              BVar31 = 0xffffffffffffffff;
            }
            else {
              uVar20 = uVar37 + 1;
              uVar30 = 0;
              do {
                uVar38 = 1L << ((byte)pIVar17->aiColumn[uVar20 - 2] & 0x3f);
                if (0x3e < (ushort)pIVar17->aiColumn[uVar20 - 2]) {
                  uVar38 = 0;
                }
                uVar30 = uVar30 | uVar38;
                uVar20 = uVar20 - 1;
              } while (1 < uVar20);
              BVar31 = ~uVar30;
            }
            pIVar17->colNotIdxed = BVar31;
            if ((pTblName != (SrcList *)0x0) && ((int)pTVar11->nCol <= (int)(uint)uVar3)) {
              uVar4 = *(ushort *)&pIVar17->field_0x63;
              *(ushort *)&pIVar17->field_0x63 = uVar4 | 0x20;
              if (0 < pTVar11->nCol) {
                iVar10 = 0;
                do {
                  if (iVar10 != pTVar11->iPKey) {
                    if (uVar37 != 0) {
                      uVar20 = 0;
                      while (pIVar17->aiColumn[uVar20] != (short)iVar10) {
                        uVar20 = uVar20 + 1;
                        if ((uint)uVar3 == uVar20) goto LAB_0015cc10;
                      }
                      if (-1 < (short)uVar20) goto LAB_0015cbf0;
                    }
LAB_0015cc10:
                    *(ushort *)&pIVar17->field_0x63 = uVar4 & 0xffdf;
                    break;
                  }
LAB_0015cbf0:
                  iVar10 = iVar10 + 1;
                } while (iVar10 != pTVar11->nCol);
              }
            }
            if ((pTVar11 == pParse->pNewTable) &&
               (pIVar23 = pTVar11->pIndex, pIVar23 != (Index *)0x0)) {
              uVar3 = pIVar17->nKeyCol;
              do {
                if (pIVar23->nKeyCol == uVar3) {
                  if ((ulong)uVar3 == 0) {
                    uVar37 = 0;
                  }
                  else {
                    piVar7 = pIVar23->aiColumn;
                    piVar8 = pIVar17->aiColumn;
                    uVar37 = 0;
                    while ((piVar7[uVar37] == piVar8[uVar37] &&
                           (iVar10 = sqlite3StrICmp(pIVar23->azColl[uVar37],pIVar17->azColl[uVar37])
                           , iVar10 == 0))) {
                      uVar37 = uVar37 + 1;
                      if (uVar3 == uVar37) goto LAB_0015cd92;
                    }
                  }
                  local_d0 = (uint)uVar3;
                  if ((uint)uVar37 == local_d0) {
LAB_0015cd92:
                    uVar9 = pIVar23->onError;
                    if (uVar9 != pIVar17->onError) {
                      if ((uVar9 != '\v') && (pIVar17->onError != '\v')) {
                        sqlite3ErrorMsg(pParse,"conflicting ON CONFLICT clauses specified",0);
                        uVar9 = pIVar23->onError;
                      }
                      if (uVar9 == '\v') {
                        pIVar23->onError = pIVar17->onError;
                      }
                    }
                    if (idxType == '\x02') {
                      *(ushort *)&pIVar23->field_0x63 = *(ushort *)&pIVar23->field_0x63 & 0xfffc | 2
                      ;
                    }
                    if (pParse->eParseMode < 2) goto LAB_0015ce1d;
                    pIVar17->pNext = pParse->pNewIndex;
                    pParse->pNewIndex = pIVar17;
                    goto LAB_0015c170;
                  }
                }
                pIVar23 = pIVar23->pNext;
              } while (pIVar23 != (Index *)0x0);
            }
            if (1 < pParse->eParseMode) {
LAB_0015cc43:
              if ((pTblName == (SrcList *)0x0) || ((db->init).busy != '\0')) {
LAB_0015ce49:
                pIVar23 = pTVar11->pIndex;
                if (onError == 5) {
                  if (pIVar23 == (Index *)0x0) {
                    pIVar23 = (Index *)0x0;
                  }
                  else if (pIVar23->onError != '\x05') {
                    do {
                      pIVar22 = pIVar23;
                      pIVar23 = pIVar22->pNext;
                      if (pIVar23 == (Index *)0x0) break;
                    } while (pIVar23->onError != '\x05');
                    pIVar17->pNext = pIVar23;
                    pIVar22->pNext = pIVar17;
                    goto LAB_0015c170;
                  }
                }
                pIVar17->pNext = pIVar23;
                pTVar11->pIndex = pIVar17;
                goto LAB_0015c170;
              }
              if (1 < pParse->eParseMode) {
                pParse->pNewIndex = pIVar17;
                goto LAB_0015c170;
              }
LAB_0015d0e8:
              pPIWhere = (Expr *)0x0;
              goto LAB_0015c72a;
            }
            if ((db->init).busy == '\0') {
              if ((pTblName == (SrcList *)0x0) && ((pTVar11->tabFlags & 0x20) != 0))
              goto LAB_0015ce49;
              uVar25 = pParse->nMem + 1;
              pParse->nMem = uVar25;
              p = sqlite3GetVdbe(pParse);
              if (p != (Vdbe *)0x0) {
                sqlite3BeginWriteOperation(pParse,1,iDb);
                local_c8 = (char *)0x0;
                iVar10 = sqlite3VdbeAddOp3(p,0xaa,0,0,0);
                pIVar17->tnum = iVar10;
                sqlite3VdbeAddOp3(p,0x8b,iDb,uVar25,2);
                if (pStart != (Token *)0x0) {
                  iVar10 = (*(int *)&(pParse->sLastToken).z - (int)pName_00->z) +
                           (pParse->sLastToken).n;
                  pcVar33 = " UNIQUE";
                  if (onError == 0) {
                    pcVar33 = "";
                  }
                  local_c8 = sqlite3MPrintf(db,"CREATE%s INDEX %.*s",pcVar33,
                                            (ulong)(iVar10 - (uint)(pName_00->z[(long)iVar10 + -1]
                                                                   == ';')));
                }
                sqlite3NestedParse(pParse,"INSERT INTO %Q.%s VALUES(\'index\',%Q,%Q,#%d,%Q);",
                                   *(undefined8 *)((long)&db->aDb->zDbSName + local_88),
                                   "sqlite_master",pIVar17->zName,pTVar11->zName,(ulong)uVar25,
                                   local_c8);
                if (local_c8 != (char *)0x0) {
                  sqlite3DbFreeNN(db,local_c8);
                }
                if (pTblName != (SrcList *)0x0) {
                  sqlite3RefillIndex(pParse,pIVar17,uVar25);
                  sqlite3VdbeAddOp3(pParse->pVdbe,0x5f,iDb,1,
                                    **(int **)((long)&pParse->db->aDb->pSchema + local_88) + 1);
                  pcVar33 = sqlite3MPrintf(db,"name=\'%q\' AND type=\'index\'",pIVar17->zName);
                  sqlite3VdbeAddParseSchemaOp(p,iDb,pcVar33);
                  sqlite3VdbeAddOp3(p,0x9e,0,1,0);
                }
                if (p->db->mallocFailed == '\0') {
                  iVar10 = p->nOp + -1;
                  if (-1 < pIVar17->tnum) {
                    iVar10 = pIVar17->tnum;
                  }
                  pOVar29 = p->aOp + iVar10;
                }
                else {
                  pOVar29 = (Op *)&sqlite3VdbeGetOp_dummy;
                }
                pOVar29->p2 = p->nOp;
                goto LAB_0015cc43;
              }
              goto LAB_0015d0e8;
            }
            if (pTblName != (SrcList *)0x0) {
              iVar10 = (db->init).newTnum;
              pIVar17->tnum = iVar10;
              for (pIVar23 = pIVar17->pTable->pIndex; pIVar23 != (Index *)0x0;
                  pIVar23 = pIVar23->pNext) {
                if ((pIVar23 != pIVar17) && (pIVar23->tnum == iVar10)) {
                  sqlite3ErrorMsg(pParse,"invalid rootpage");
                  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1af0d,
                              "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
                  pParse->rc = 0xb;
                  goto LAB_0015d0e8;
                }
              }
            }
            pvVar21 = sqlite3HashInsert(&pIVar17->pSchema->idxHash,pIVar17->zName,pIVar17);
            if (pvVar21 == (void *)0x0) {
              *(byte *)&db->mDbFlags = (byte)db->mDbFlags | 1;
              goto LAB_0015cc43;
            }
            sqlite3OomFault(db);
LAB_0015ce1d:
            pPIWhere = (Expr *)0x0;
          }
          else {
LAB_0015c72a:
            if (pIVar17 == (Index *)0x0) goto LAB_0015c15d;
          }
LAB_0015ce21:
          sqlite3FreeIndex(db,pIVar17);
        }
      }
    }
    else {
      pcVar33 = "views may not be indexed";
LAB_0015c411:
      zName = (char *)0x0;
      sqlite3ErrorMsg(pParse,pcVar33);
    }
  }
  else {
LAB_0015c15a:
    zName = (char *)0x0;
  }
LAB_0015c15d:
  if (pPIWhere != (Expr *)0x0) {
    sqlite3ExprDeleteNN(db,pPIWhere);
  }
LAB_0015c170:
  if (pList != (ExprList *)0x0) {
    exprListDeleteNN(db,pList);
  }
  sqlite3SrcListDelete(db,pTblName);
  if (zName != (char *)0x0) {
    sqlite3DbFreeNN(db,zName);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CreateIndex(
  Parse *pParse,     /* All information about this parse */
  Token *pName1,     /* First part of index name. May be NULL */
  Token *pName2,     /* Second part of index name. May be NULL */
  SrcList *pTblName, /* Table to index. Use pParse->pNewTable if 0 */
  ExprList *pList,   /* A list of columns to be indexed */
  int onError,       /* OE_Abort, OE_Ignore, OE_Replace, or OE_None */
  Token *pStart,     /* The CREATE token that begins this statement */
  Expr *pPIWhere,    /* WHERE clause for partial indices */
  int sortOrder,     /* Sort order of primary key when pList==NULL */
  int ifNotExist,    /* Omit error if index already exists */
  u8 idxType         /* The index type */
){
  Table *pTab = 0;     /* Table to be indexed */
  Index *pIndex = 0;   /* The index to be created */
  char *zName = 0;     /* Name of the index */
  int nName;           /* Number of characters in zName */
  int i, j;
  DbFixer sFix;        /* For assigning database names to pTable */
  int sortOrderMask;   /* 1 to honor DESC in index.  0 to ignore. */
  sqlite3 *db = pParse->db;
  Db *pDb;             /* The specific table containing the indexed database */
  int iDb;             /* Index of the database that is being written */
  Token *pName = 0;    /* Unqualified name of the index to create */
  struct ExprList_item *pListItem; /* For looping over pList */
  int nExtra = 0;                  /* Space allocated for zExtra[] */
  int nExtraCol;                   /* Number of extra columns needed */
  char *zExtra = 0;                /* Extra space after the Index object */
  Index *pPk = 0;      /* PRIMARY KEY index for WITHOUT ROWID tables */

  if( db->mallocFailed || pParse->nErr>0 ){
    goto exit_create_index;
  }
  if( IN_DECLARE_VTAB && idxType!=SQLITE_IDXTYPE_PRIMARYKEY ){
    goto exit_create_index;
  }
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    goto exit_create_index;
  }

  /*
  ** Find the table that is to be indexed.  Return early if not found.
  */
  if( pTblName!=0 ){

    /* Use the two-part index name to determine the database 
    ** to search for the table. 'Fix' the table name to this db
    ** before looking up the table.
    */
    assert( pName1 && pName2 );
    iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pName);
    if( iDb<0 ) goto exit_create_index;
    assert( pName && pName->z );

#ifndef SQLITE_OMIT_TEMPDB
    /* If the index name was unqualified, check if the table
    ** is a temp table. If so, set the database to 1. Do not do this
    ** if initialising a database schema.
    */
    if( !db->init.busy ){
      pTab = sqlite3SrcListLookup(pParse, pTblName);
      if( pName2->n==0 && pTab && pTab->pSchema==db->aDb[1].pSchema ){
        iDb = 1;
      }
    }
#endif

    sqlite3FixInit(&sFix, pParse, iDb, "index", pName);
    if( sqlite3FixSrcList(&sFix, pTblName) ){
      /* Because the parser constructs pTblName from a single identifier,
      ** sqlite3FixSrcList can never fail. */
      assert(0);
    }
    pTab = sqlite3LocateTableItem(pParse, 0, &pTblName->a[0]);
    assert( db->mallocFailed==0 || pTab==0 );
    if( pTab==0 ) goto exit_create_index;
    if( iDb==1 && db->aDb[iDb].pSchema!=pTab->pSchema ){
      sqlite3ErrorMsg(pParse, 
           "cannot create a TEMP index on non-TEMP table \"%s\"",
           pTab->zName);
      goto exit_create_index;
    }
    if( !HasRowid(pTab) ) pPk = sqlite3PrimaryKeyIndex(pTab);
  }else{
    assert( pName==0 );
    assert( pStart==0 );
    pTab = pParse->pNewTable;
    if( !pTab ) goto exit_create_index;
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  }
  pDb = &db->aDb[iDb];

  assert( pTab!=0 );
  assert( pParse->nErr==0 );
  if( sqlite3StrNICmp(pTab->zName, "sqlite_", 7)==0 
       && db->init.busy==0
       && pTblName!=0
#if SQLITE_USER_AUTHENTICATION
       && sqlite3UserAuthTable(pTab->zName)==0
#endif
#ifdef SQLITE_ALLOW_SQLITE_MASTER_INDEX
       && sqlite3StrICmp(&pTab->zName[7],"master")!=0
#endif
 ){
    sqlite3ErrorMsg(pParse, "table %s may not be indexed", pTab->zName);
    goto exit_create_index;
  }
#ifndef SQLITE_OMIT_VIEW
  if( pTab->pSelect ){
    sqlite3ErrorMsg(pParse, "views may not be indexed");
    goto exit_create_index;
  }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pTab) ){
    sqlite3ErrorMsg(pParse, "virtual tables may not be indexed");
    goto exit_create_index;
  }
#endif

  /*
  ** Find the name of the index.  Make sure there is not already another
  ** index or table with the same name.  
  **
  ** Exception:  If we are reading the names of permanent indices from the
  ** sqlite_master table (because some other process changed the schema) and
  ** one of the index names collides with the name of a temporary table or
  ** index, then we will continue to process this index.
  **
  ** If pName==0 it means that we are
  ** dealing with a primary key or UNIQUE constraint.  We have to invent our
  ** own name.
  */
  if( pName ){
    zName = sqlite3NameFromToken(db, pName);
    if( zName==0 ) goto exit_create_index;
    assert( pName->z!=0 );
    if( SQLITE_OK!=sqlite3CheckObjectName(pParse, zName) ){
      goto exit_create_index;
    }
    if( !IN_RENAME_OBJECT ){
      if( !db->init.busy ){
        if( sqlite3FindTable(db, zName, 0)!=0 ){
          sqlite3ErrorMsg(pParse, "there is already a table named %s", zName);
          goto exit_create_index;
        }
      }
      if( sqlite3FindIndex(db, zName, pDb->zDbSName)!=0 ){
        if( !ifNotExist ){
          sqlite3ErrorMsg(pParse, "index %s already exists", zName);
        }else{
          assert( !db->init.busy );
          sqlite3CodeVerifySchema(pParse, iDb);
        }
        goto exit_create_index;
      }
    }
  }else{
    int n;
    Index *pLoop;
    for(pLoop=pTab->pIndex, n=1; pLoop; pLoop=pLoop->pNext, n++){}
    zName = sqlite3MPrintf(db, "sqlite_autoindex_%s_%d", pTab->zName, n);
    if( zName==0 ){
      goto exit_create_index;
    }

    /* Automatic index names generated from within sqlite3_declare_vtab()
    ** must have names that are distinct from normal automatic index names.
    ** The following statement converts "sqlite3_autoindex..." into
    ** "sqlite3_butoindex..." in order to make the names distinct.
    ** The "vtab_err.test" test demonstrates the need of this statement. */
    if( IN_SPECIAL_PARSE ) zName[7]++;
  }

  /* Check for authorization to create an index.
  */
#ifndef SQLITE_OMIT_AUTHORIZATION
  if( !IN_RENAME_OBJECT ){
    const char *zDb = pDb->zDbSName;
    if( sqlite3AuthCheck(pParse, SQLITE_INSERT, SCHEMA_TABLE(iDb), 0, zDb) ){
      goto exit_create_index;
    }
    i = SQLITE_CREATE_INDEX;
    if( !OMIT_TEMPDB && iDb==1 ) i = SQLITE_CREATE_TEMP_INDEX;
    if( sqlite3AuthCheck(pParse, i, zName, pTab->zName, zDb) ){
      goto exit_create_index;
    }
  }
#endif

  /* If pList==0, it means this routine was called to make a primary
  ** key out of the last column added to the table under construction.
  ** So create a fake list to simulate this.
  */
  if( pList==0 ){
    Token prevCol;
    Column *pCol = &pTab->aCol[pTab->nCol-1];
    pCol->colFlags |= COLFLAG_UNIQUE;
    sqlite3TokenInit(&prevCol, pCol->zName);
    pList = sqlite3ExprListAppend(pParse, 0,
              sqlite3ExprAlloc(db, TK_ID, &prevCol, 0));
    if( pList==0 ) goto exit_create_index;
    assert( pList->nExpr==1 );
    sqlite3ExprListSetSortOrder(pList, sortOrder);
  }else{
    sqlite3ExprListCheckLength(pParse, pList, "index");
    if( pParse->nErr ) goto exit_create_index;
  }

  /* Figure out how many bytes of space are required to store explicitly
  ** specified collation sequence names.
  */
  for(i=0; i<pList->nExpr; i++){
    Expr *pExpr = pList->a[i].pExpr;
    assert( pExpr!=0 );
    if( pExpr->op==TK_COLLATE ){
      nExtra += (1 + sqlite3Strlen30(pExpr->u.zToken));
    }
  }

  /* 
  ** Allocate the index structure. 
  */
  nName = sqlite3Strlen30(zName);
  nExtraCol = pPk ? pPk->nKeyCol : 1;
  assert( pList->nExpr + nExtraCol <= 32767 /* Fits in i16 */ );
  pIndex = sqlite3AllocateIndexObject(db, pList->nExpr + nExtraCol,
                                      nName + nExtra + 1, &zExtra);
  if( db->mallocFailed ){
    goto exit_create_index;
  }
  assert( EIGHT_BYTE_ALIGNMENT(pIndex->aiRowLogEst) );
  assert( EIGHT_BYTE_ALIGNMENT(pIndex->azColl) );
  pIndex->zName = zExtra;
  zExtra += nName + 1;
  memcpy(pIndex->zName, zName, nName+1);
  pIndex->pTable = pTab;
  pIndex->onError = (u8)onError;
  pIndex->uniqNotNull = onError!=OE_None;
  pIndex->idxType = idxType;
  pIndex->pSchema = db->aDb[iDb].pSchema;
  pIndex->nKeyCol = pList->nExpr;
  if( pPIWhere ){
    sqlite3ResolveSelfReference(pParse, pTab, NC_PartIdx, pPIWhere, 0);
    pIndex->pPartIdxWhere = pPIWhere;
    pPIWhere = 0;
  }
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );

  /* Check to see if we should honor DESC requests on index columns
  */
  if( pDb->pSchema->file_format>=4 ){
    sortOrderMask = -1;   /* Honor DESC */
  }else{
    sortOrderMask = 0;    /* Ignore DESC */
  }

  /* Analyze the list of expressions that form the terms of the index and
  ** report any errors.  In the common case where the expression is exactly
  ** a table column, store that column in aiColumn[].  For general expressions,
  ** populate pIndex->aColExpr and store XN_EXPR (-2) in aiColumn[].
  **
  ** TODO: Issue a warning if two or more columns of the index are identical.
  ** TODO: Issue a warning if the table primary key is used as part of the
  ** index key.
  */
  pListItem = pList->a;
  if( IN_RENAME_OBJECT ){
    pIndex->aColExpr = pList;
    pList = 0;
  }
  for(i=0; i<pIndex->nKeyCol; i++, pListItem++){
    Expr *pCExpr;                  /* The i-th index expression */
    int requestedSortOrder;        /* ASC or DESC on the i-th expression */
    const char *zColl;             /* Collation sequence name */

    sqlite3StringToId(pListItem->pExpr);
    sqlite3ResolveSelfReference(pParse, pTab, NC_IdxExpr, pListItem->pExpr, 0);
    if( pParse->nErr ) goto exit_create_index;
    pCExpr = sqlite3ExprSkipCollate(pListItem->pExpr);
    if( pCExpr->op!=TK_COLUMN ){
      if( pTab==pParse->pNewTable ){
        sqlite3ErrorMsg(pParse, "expressions prohibited in PRIMARY KEY and "
                                "UNIQUE constraints");
        goto exit_create_index;
      }
      if( pIndex->aColExpr==0 ){
        pIndex->aColExpr = pList;
        pList = 0;
      }
      j = XN_EXPR;
      pIndex->aiColumn[i] = XN_EXPR;
      pIndex->uniqNotNull = 0;
    }else{
      j = pCExpr->iColumn;
      assert( j<=0x7fff );
      if( j<0 ){
        j = pTab->iPKey;
      }else if( pTab->aCol[j].notNull==0 ){
        pIndex->uniqNotNull = 0;
      }
      pIndex->aiColumn[i] = (i16)j;
    }
    zColl = 0;
    if( pListItem->pExpr->op==TK_COLLATE ){
      int nColl;
      zColl = pListItem->pExpr->u.zToken;
      nColl = sqlite3Strlen30(zColl) + 1;
      assert( nExtra>=nColl );
      memcpy(zExtra, zColl, nColl);
      zColl = zExtra;
      zExtra += nColl;
      nExtra -= nColl;
    }else if( j>=0 ){
      zColl = pTab->aCol[j].zColl;
    }
    if( !zColl ) zColl = sqlite3StrBINARY;
    if( !db->init.busy && !sqlite3LocateCollSeq(pParse, zColl) ){
      goto exit_create_index;
    }
    pIndex->azColl[i] = zColl;
    requestedSortOrder = pListItem->sortOrder & sortOrderMask;
    pIndex->aSortOrder[i] = (u8)requestedSortOrder;
  }

  /* Append the table key to the end of the index.  For WITHOUT ROWID
  ** tables (when pPk!=0) this will be the declared PRIMARY KEY.  For
  ** normal tables (when pPk==0) this will be the rowid.
  */
  if( pPk ){
    for(j=0; j<pPk->nKeyCol; j++){
      int x = pPk->aiColumn[j];
      assert( x>=0 );
      if( hasColumn(pIndex->aiColumn, pIndex->nKeyCol, x) ){
        pIndex->nColumn--; 
      }else{
        pIndex->aiColumn[i] = x;
        pIndex->azColl[i] = pPk->azColl[j];
        pIndex->aSortOrder[i] = pPk->aSortOrder[j];
        i++;
      }
    }
    assert( i==pIndex->nColumn );
  }else{
    pIndex->aiColumn[i] = XN_ROWID;
    pIndex->azColl[i] = sqlite3StrBINARY;
  }
  sqlite3DefaultRowEst(pIndex);
  if( pParse->pNewTable==0 ) estimateIndexWidth(pIndex);

  /* If this index contains every column of its table, then mark
  ** it as a covering index */
  assert( HasRowid(pTab) 
      || pTab->iPKey<0 || sqlite3ColumnOfIndex(pIndex, pTab->iPKey)>=0 );
  recomputeColumnsNotIndexed(pIndex);
  if( pTblName!=0 && pIndex->nColumn>=pTab->nCol ){
    pIndex->isCovering = 1;
    for(j=0; j<pTab->nCol; j++){
      if( j==pTab->iPKey ) continue;
      if( sqlite3ColumnOfIndex(pIndex,j)>=0 ) continue;
      pIndex->isCovering = 0;
      break;
    }
  }

  if( pTab==pParse->pNewTable ){
    /* This routine has been called to create an automatic index as a
    ** result of a PRIMARY KEY or UNIQUE clause on a column definition, or
    ** a PRIMARY KEY or UNIQUE clause following the column definitions.
    ** i.e. one of:
    **
    ** CREATE TABLE t(x PRIMARY KEY, y);
    ** CREATE TABLE t(x, y, UNIQUE(x, y));
    **
    ** Either way, check to see if the table already has such an index. If
    ** so, don't bother creating this one. This only applies to
    ** automatically created indices. Users can do as they wish with
    ** explicit indices.
    **
    ** Two UNIQUE or PRIMARY KEY constraints are considered equivalent
    ** (and thus suppressing the second one) even if they have different
    ** sort orders.
    **
    ** If there are different collating sequences or if the columns of
    ** the constraint occur in different orders, then the constraints are
    ** considered distinct and both result in separate indices.
    */
    Index *pIdx;
    for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
      int k;
      assert( IsUniqueIndex(pIdx) );
      assert( pIdx->idxType!=SQLITE_IDXTYPE_APPDEF );
      assert( IsUniqueIndex(pIndex) );

      if( pIdx->nKeyCol!=pIndex->nKeyCol ) continue;
      for(k=0; k<pIdx->nKeyCol; k++){
        const char *z1;
        const char *z2;
        assert( pIdx->aiColumn[k]>=0 );
        if( pIdx->aiColumn[k]!=pIndex->aiColumn[k] ) break;
        z1 = pIdx->azColl[k];
        z2 = pIndex->azColl[k];
        if( sqlite3StrICmp(z1, z2) ) break;
      }
      if( k==pIdx->nKeyCol ){
        if( pIdx->onError!=pIndex->onError ){
          /* This constraint creates the same index as a previous
          ** constraint specified somewhere in the CREATE TABLE statement.
          ** However the ON CONFLICT clauses are different. If both this 
          ** constraint and the previous equivalent constraint have explicit
          ** ON CONFLICT clauses this is an error. Otherwise, use the
          ** explicitly specified behavior for the index.
          */
          if( !(pIdx->onError==OE_Default || pIndex->onError==OE_Default) ){
            sqlite3ErrorMsg(pParse, 
                "conflicting ON CONFLICT clauses specified", 0);
          }
          if( pIdx->onError==OE_Default ){
            pIdx->onError = pIndex->onError;
          }
        }
        if( idxType==SQLITE_IDXTYPE_PRIMARYKEY ) pIdx->idxType = idxType;
        if( IN_RENAME_OBJECT ){
          pIndex->pNext = pParse->pNewIndex;
          pParse->pNewIndex = pIndex;
          pIndex = 0;
        }
        goto exit_create_index;
      }
    }
  }

  if( !IN_RENAME_OBJECT ){

    /* Link the new Index structure to its table and to the other
    ** in-memory database structures. 
    */
    assert( pParse->nErr==0 );
    if( db->init.busy ){
      Index *p;
      assert( !IN_SPECIAL_PARSE );
      assert( sqlite3SchemaMutexHeld(db, 0, pIndex->pSchema) );
      if( pTblName!=0 ){
        pIndex->tnum = db->init.newTnum;
        if( sqlite3IndexHasDuplicateRootPage(pIndex) ){
          sqlite3ErrorMsg(pParse, "invalid rootpage");
          pParse->rc = SQLITE_CORRUPT_BKPT;
          goto exit_create_index;
        }
      }
      p = sqlite3HashInsert(&pIndex->pSchema->idxHash, 
          pIndex->zName, pIndex);
      if( p ){
        assert( p==pIndex );  /* Malloc must have failed */
        sqlite3OomFault(db);
        goto exit_create_index;
      }
      db->mDbFlags |= DBFLAG_SchemaChange;
    }

    /* If this is the initial CREATE INDEX statement (or CREATE TABLE if the
    ** index is an implied index for a UNIQUE or PRIMARY KEY constraint) then
    ** emit code to allocate the index rootpage on disk and make an entry for
    ** the index in the sqlite_master table and populate the index with
    ** content.  But, do not do this if we are simply reading the sqlite_master
    ** table to parse the schema, or if this index is the PRIMARY KEY index
    ** of a WITHOUT ROWID table.
    **
    ** If pTblName==0 it means this index is generated as an implied PRIMARY KEY
    ** or UNIQUE index in a CREATE TABLE statement.  Since the table
    ** has just been created, it contains no data and the index initialization
    ** step can be skipped.
    */
    else if( HasRowid(pTab) || pTblName!=0 ){
      Vdbe *v;
      char *zStmt;
      int iMem = ++pParse->nMem;

      v = sqlite3GetVdbe(pParse);
      if( v==0 ) goto exit_create_index;

      sqlite3BeginWriteOperation(pParse, 1, iDb);

      /* Create the rootpage for the index using CreateIndex. But before
      ** doing so, code a Noop instruction and store its address in 
      ** Index.tnum. This is required in case this index is actually a 
      ** PRIMARY KEY and the table is actually a WITHOUT ROWID table. In 
      ** that case the convertToWithoutRowidTable() routine will replace
      ** the Noop with a Goto to jump over the VDBE code generated below. */
      pIndex->tnum = sqlite3VdbeAddOp0(v, OP_Noop);
      sqlite3VdbeAddOp3(v, OP_CreateBtree, iDb, iMem, BTREE_BLOBKEY);

      /* Gather the complete text of the CREATE INDEX statement into
      ** the zStmt variable
      */
      if( pStart ){
        int n = (int)(pParse->sLastToken.z - pName->z) + pParse->sLastToken.n;
        if( pName->z[n-1]==';' ) n--;
        /* A named index with an explicit CREATE INDEX statement */
        zStmt = sqlite3MPrintf(db, "CREATE%s INDEX %.*s",
            onError==OE_None ? "" : " UNIQUE", n, pName->z);
      }else{
        /* An automatic index created by a PRIMARY KEY or UNIQUE constraint */
        /* zStmt = sqlite3MPrintf(""); */
        zStmt = 0;
      }

      /* Add an entry in sqlite_master for this index
      */
      sqlite3NestedParse(pParse, 
          "INSERT INTO %Q.%s VALUES('index',%Q,%Q,#%d,%Q);",
          db->aDb[iDb].zDbSName, MASTER_NAME,
          pIndex->zName,
          pTab->zName,
          iMem,
          zStmt
          );
      sqlite3DbFree(db, zStmt);

      /* Fill the index with data and reparse the schema. Code an OP_Expire
      ** to invalidate all pre-compiled statements.
      */
      if( pTblName ){
        sqlite3RefillIndex(pParse, pIndex, iMem);
        sqlite3ChangeCookie(pParse, iDb);
        sqlite3VdbeAddParseSchemaOp(v, iDb,
            sqlite3MPrintf(db, "name='%q' AND type='index'", pIndex->zName));
        sqlite3VdbeAddOp2(v, OP_Expire, 0, 1);
      }

      sqlite3VdbeJumpHere(v, pIndex->tnum);
    }
  }

  /* When adding an index to the list of indices for a table, make
  ** sure all indices labeled OE_Replace come after all those labeled
  ** OE_Ignore.  This is necessary for the correct constraint check
  ** processing (in sqlite3GenerateConstraintChecks()) as part of
  ** UPDATE and INSERT statements.  
  */
  if( db->init.busy || pTblName==0 ){
    if( onError!=OE_Replace || pTab->pIndex==0
         || pTab->pIndex->onError==OE_Replace){
      pIndex->pNext = pTab->pIndex;
      pTab->pIndex = pIndex;
    }else{
      Index *pOther = pTab->pIndex;
      while( pOther->pNext && pOther->pNext->onError!=OE_Replace ){
        pOther = pOther->pNext;
      }
      pIndex->pNext = pOther->pNext;
      pOther->pNext = pIndex;
    }
    pIndex = 0;
  }
  else if( IN_RENAME_OBJECT ){
    assert( pParse->pNewIndex==0 );
    pParse->pNewIndex = pIndex;
    pIndex = 0;
  }

  /* Clean up before exiting */
exit_create_index:
  if( pIndex ) sqlite3FreeIndex(db, pIndex);
  sqlite3ExprDelete(db, pPIWhere);
  sqlite3ExprListDelete(db, pList);
  sqlite3SrcListDelete(db, pTblName);
  sqlite3DbFree(db, zName);
}